

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

bool __thiscall depspawn::internal::arg_info::is_contained_array(arg_info *this,arg_info *other)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  cVar1 = this->rank;
  uVar3 = (uint)cVar1;
  do {
    uVar2 = 0;
    if ('\0' < cVar1) {
      uVar2 = 0;
      while ((other->array_range[uVar2].first <= this->array_range[uVar2].first &&
             (this->array_range[uVar2].second <= other->array_range[uVar2].second))) {
        uVar2 = uVar2 + 1;
        if (uVar3 == uVar2) {
          return true;
        }
      }
    }
    bVar4 = (uint)uVar2 == uVar3;
  } while ((!bVar4) &&
          ((other = other->next, other != (arg_info *)0x0 && (this->addr == other->addr))));
  return bVar4;
}

Assistant:

bool arg_info::is_contained_array(const arg_info *other) const
    { int i;
      
      const int lim = rank;
      
      do {

          assert(lim == other->rank);
          
          for(i = 0; i < lim; i++) {
            if(!contains_intervals(std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i]),
                                   std::get<0>(array_range[i]), std::get<1>(array_range[i])))
              break;
          }
          
          if(i == lim) {
            //if(depspawn::debug) std::cout << "DEP FOUND\n";
            return true;
          }

 
        other = other->next;

      } while(other && (addr == other->addr));
      
      return false;
    }